

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void google::protobuf::internal::WriteLengthDelimited(uint32 num,StringPiece val,string *s)

{
  char *pcVar1;
  char *in_RCX;
  string *in_stack_ffffffffffffffc8;
  uint64 in_stack_ffffffffffffffd0;
  StringPiece local_10;
  
  WriteVarint(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  StringPiece::size(&local_10);
  WriteVarint(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pcVar1 = StringPiece::data(&local_10);
  StringPiece::size(&local_10);
  std::__cxx11::string::append(in_RCX,(ulong)pcVar1);
  return;
}

Assistant:

void WriteLengthDelimited(uint32 num, StringPiece val, std::string* s) {
  WriteVarint((num << 3) + 2, s);
  WriteVarint(val.size(), s);
  s->append(val.data(), val.size());
}